

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::NegativeTest10::initTestCases(NegativeTest10 *this)

{
  ostream *poVar1;
  _shader_stage *shader_stage;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0 [32];
  string local_2d0;
  string local_2b0;
  string local_290;
  undefined1 local_260 [8];
  _test_case test_case;
  stringstream name_sstream;
  ostream local_190;
  int local_18;
  int local_14;
  _shader_stage offending_shader_stage;
  int offending_shader_stage_it;
  NegativeTest10 *this_local;
  
  _offending_shader_stage = this;
  for (local_14 = 0; local_14 != 5; local_14 = local_14 + 1) {
    local_18 = local_14;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(test_case.vs_body.field_2._M_local_buf + 8));
    _test_case::_test_case((_test_case *)local_260);
    poVar1 = std::operator<<(&local_190,"Broken shader stage:");
    Utils::getShaderStageString_abi_cxx11_(&local_290,(Utils *)&local_18,shader_stage);
    std::operator<<(poVar1,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    getFragmentShader_abi_cxx11_(&local_2b0,this,local_18 == 4);
    std::__cxx11::string::operator=
              ((string *)(test_case.name.field_2._M_local_buf + 8),(string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    getGeometryShader_abi_cxx11_(&local_2d0,this,local_18 == 3);
    std::__cxx11::string::operator=
              ((string *)(test_case.fs_body.field_2._M_local_buf + 8),(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)local_260,local_2f0);
    std::__cxx11::string::~string(local_2f0);
    getTessellationControlShader_abi_cxx11_(&local_310,this,local_18 == 1);
    std::__cxx11::string::operator=
              ((string *)(test_case.gs_body.field_2._M_local_buf + 8),(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    getTessellationEvaluationShader_abi_cxx11_(&local_330,this,local_18 == 2);
    std::__cxx11::string::operator=
              ((string *)(test_case.tc_body.field_2._M_local_buf + 8),(string *)&local_330);
    std::__cxx11::string::~string((string *)&local_330);
    getVertexShader_abi_cxx11_(&local_350,this,local_18 == 0);
    std::__cxx11::string::operator=
              ((string *)(test_case.te_body.field_2._M_local_buf + 8),(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::
    vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
    ::push_back(&this->m_test_cases,(value_type *)local_260);
    _test_case::~_test_case((_test_case *)local_260);
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(test_case.vs_body.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void NegativeTest10::initTestCases()
{
	/* For each test case, only one shader stage should define a function that
	 * has already been defined as a subroutine. */
	for (int offending_shader_stage_it = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 offending_shader_stage_it != static_cast<int>(Utils::SHADER_STAGE_COUNT); ++offending_shader_stage_it)
	{
		Utils::_shader_stage offending_shader_stage = static_cast<Utils::_shader_stage>(offending_shader_stage_it);
		/* Form the test case descriptor */
		std::stringstream name_sstream;
		_test_case		  test_case;

		name_sstream << "Broken shader stage:" << Utils::getShaderStageString(offending_shader_stage);

		test_case.fs_body = getFragmentShader(offending_shader_stage == Utils::SHADER_STAGE_FRAGMENT);
		test_case.gs_body = getGeometryShader(offending_shader_stage == Utils::SHADER_STAGE_GEOMETRY);
		test_case.name	= name_sstream.str();
		test_case.tc_body =
			getTessellationControlShader(offending_shader_stage == Utils::SHADER_STAGE_TESSELLATION_CONTROL);
		test_case.te_body =
			getTessellationEvaluationShader(offending_shader_stage == Utils::SHADER_STAGE_TESSELLATION_EVALUATION);
		test_case.vs_body = getVertexShader(offending_shader_stage == Utils::SHADER_STAGE_VERTEX);

		m_test_cases.push_back(test_case);
	}
}